

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall httplib::Server::read_content(Server *this,Stream *strm,Request *req,Response *res)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cache;
  iterator cur;
  undefined1 local_108 [32];
  _Base_ptr local_e8;
  size_t local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  long *local_58 [2];
  long local_48 [2];
  undefined8 local_38;
  
  local_d8._M_unused._M_object = &local_38;
  local_38 = 0;
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:5171:11)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:5171:11)>
             ::_M_manager;
  local_a0 = std::
             _Function_handler<bool_(const_httplib::MultipartFormData_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:5177:11)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<bool_(const_httplib::MultipartFormData_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:5177:11)>
             ::_M_manager;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:5181:11)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:5181:11)>
             ::_M_manager;
  local_b8._M_unused._M_object = local_d8._M_unused._M_object;
  local_b8._8_8_ = req;
  local_98._M_unused._M_object = req;
  bVar2 = read_content_core(this,strm,req,res,(ContentReceiver *)&local_98,
                            (MultipartContentHeader *)&local_b8,(ContentReceiver *)&local_d8);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (bVar2) {
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Content-Type","");
    pVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::equal_range(&(req->headers)._M_t,(key_type *)local_108);
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    if (pVar5.first._M_node._M_node == pVar5.second._M_node._M_node) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)(pVar5.first._M_node._M_node + 2);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_58,pcVar4,(allocator<char> *)local_108);
    lVar3 = std::__cxx11::string::find((char *)local_58,0x152bda,0);
    bVar2 = true;
    if (lVar3 == 0) {
      uVar1 = (req->body)._M_string_length;
      if (uVar1 < 0x2001) {
        local_108._24_8_ = local_108 + 8;
        local_108._8_4_ = _S_red;
        local_108._16_8_ = 0;
        local_e0 = 0;
        pcVar4 = (req->body)._M_dataplus._M_p;
        local_78._8_8_ = &req->params;
        local_60 = std::
                   _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:3690:45)>
                   ::_M_invoke;
        local_68 = std::
                   _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h:3690:45)>
                   ::_M_manager;
        local_e8 = (_Base_ptr)local_108._24_8_;
        local_78._M_unused._0_8_ = (undefined8)(allocator<char> *)local_108;
        detail::split(pcVar4,pcVar4 + uVar1,'&',
                      (function<void_(const_char_*,_const_char_*)> *)&local_78);
        if (local_68 != (code *)0x0) {
          (*local_68)(&local_78,&local_78,__destroy_functor);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_108);
      }
      else {
        res->status = 0x19d;
        bVar2 = false;
      }
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

inline bool Server::read_content(Stream &strm, Request &req, Response &res) {
  MultipartFormDataMap::iterator cur;
  if (read_content_core(
          strm, req, res,
          // Regular
          [&](const char *buf, size_t n) {
            if (req.body.size() + n > req.body.max_size()) { return false; }
            req.body.append(buf, n);
            return true;
          },
          // Multipart
          [&](const MultipartFormData &file) {
            cur = req.files.emplace(file.name, file);
            return true;
          },
          [&](const char *buf, size_t n) {
            auto &content = cur->second.content;
            if (content.size() + n > content.max_size()) { return false; }
            content.append(buf, n);
            return true;
          })) {
    const auto &content_type = req.get_header_value("Content-Type");
    if (!content_type.find("application/x-www-form-urlencoded")) {
      if (req.body.size() > CPPHTTPLIB_REQUEST_URI_MAX_LENGTH) {
        res.status = 413; // NOTE: should be 414?
        return false;
      }
      detail::parse_query_text(req.body, req.params);
    }
    return true;
  }
  return false;
}